

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O2

int16_t WebRtcSpl_MinValueW16C(int16_t *vector,size_t length)

{
  short sVar1;
  size_t sVar2;
  short sVar3;
  
  if (length != 0) {
    sVar1 = 0x7fff;
    for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
      sVar3 = vector[sVar2];
      if (sVar1 <= vector[sVar2]) {
        sVar3 = sVar1;
      }
      sVar1 = sVar3;
    }
    return sVar1;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0x72,"int16_t WebRtcSpl_MinValueW16C(const int16_t *, size_t)");
}

Assistant:

int16_t WebRtcSpl_MinValueW16C(const int16_t* vector, size_t length) {
  int16_t minimum = WEBRTC_SPL_WORD16_MAX;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum)
      minimum = vector[i];
  }
  return minimum;
}